

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O2

int * inform_random_ints(int a,int b,size_t n)

{
  int iVar1;
  int *piVar2;
  size_t i;
  size_t sVar3;
  
  piVar2 = (int *)malloc(n * 4);
  if (piVar2 != (int *)0x0) {
    for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
      iVar1 = inform_random_int(a,b);
      piVar2[sVar3] = iVar1;
    }
  }
  return piVar2;
}

Assistant:

int *inform_random_ints(int a, int b, size_t n)
{
    int *xs = malloc(n * sizeof(int));
    if (xs == NULL)
        return NULL;
    for (size_t i = 0; i < n; ++i)
        xs[i] = inform_random_int(a, b);
    return xs;
}